

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreXmlSerializer.cpp
# Opt level: O0

bool Assimp::Ogre::OgreXmlSerializer::ImportSkeleton(IOSystem *pIOHandler,Mesh *mesh)

{
  ulong uVar1;
  element_type *peVar2;
  Skeleton *this;
  undefined1 local_78 [8];
  OgreXmlSerializer serializer;
  Skeleton *skeleton;
  undefined1 local_30 [8];
  XmlReaderPtr reader;
  Mesh *mesh_local;
  IOSystem *pIOHandler_local;
  
  if ((mesh == (Mesh *)0x0) ||
     (reader.
      super___shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)mesh,
     uVar1 = std::__cxx11::string::empty(), (uVar1 & 1) != 0)) {
    pIOHandler_local._7_1_ = false;
  }
  else {
    OpenReader((OgreXmlSerializer *)local_30,pIOHandler,
               (string *)
               &(reader.
                 super___shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi)->_M_use_count);
    peVar2 = std::
             __shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2>
             ::get((__shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2>
                    *)local_30);
    pIOHandler_local._7_1_ = peVar2 != (element_type *)0x0;
    if (pIOHandler_local._7_1_) {
      this = (Skeleton *)operator_new(0x38);
      Skeleton::Skeleton(this);
      peVar2 = std::
               __shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2>
               ::get((__shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2>
                      *)local_30);
      OgreXmlSerializer((OgreXmlSerializer *)local_78,peVar2);
      ReadSkeleton((OgreXmlSerializer *)local_78,this);
      *(Skeleton **)
       &reader.
        super___shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi[2]._M_use_count = this;
      ~OgreXmlSerializer((OgreXmlSerializer *)local_78);
    }
    std::shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>_>::~shared_ptr
              ((shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>_> *)local_30);
  }
  return pIOHandler_local._7_1_;
}

Assistant:

bool OgreXmlSerializer::ImportSkeleton(Assimp::IOSystem *pIOHandler, Mesh *mesh)
{
    if (!mesh || mesh->skeletonRef.empty())
        return false;

    XmlReaderPtr reader = OpenReader(pIOHandler, mesh->skeletonRef);
    if (!reader.get())
        return false;

    Skeleton *skeleton = new Skeleton();
    OgreXmlSerializer serializer(reader.get());
    serializer.ReadSkeleton(skeleton);
    mesh->skeleton = skeleton;
    return true;
}